

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_BasicPrinting_Test::
~PrinterTest_BasicPrinting_Test(PrinterTest_BasicPrinting_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_PrinterTest).super_Test._vptr_Test = (_func_int **)&PTR__PrinterTest_018e8740;
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  pcVar2 = (this->super_PrinterTest).out_._M_dataplus._M_p;
  paVar1 = &(this->super_PrinterTest).out_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, BasicPrinting) {
  {
    Printer printer(output(), '\0');

    printer.Print("Hello World!");
    printer.Print("  This is the same line.\n");
    printer.Print("But this is a new one.\nAnd this is another one.");
    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "Hello World!  This is the same line.\n"
            "But this is a new one.\n"
            "And this is another one.");
}